

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
 __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,
          BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> lhs,
          BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> rhs)

{
  Impl *pIVar1;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  BVar2;
  Impl *in_RCX;
  BasicExprFactory<std::allocator<char>_> *in_RDX;
  Impl *impl;
  Impl *in_stack_ffffffffffffffc8;
  
  pIVar1 = Allocate<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
                     (in_RDX,(Kind)((ulong)in_RCX >> 0x20),(int)in_RCX);
  pIVar1->lhs = (Impl *)in_RDX;
  pIVar1->rhs = in_RCX;
  BVar2 = internal::ExprBase::
          Create<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
                    (in_stack_ffffffffffffffc8);
  return (BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>)
         BVar2.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_;
}

Assistant:

ExprType MakeBinary(expr::Kind kind, LHS lhs, RHS rhs) {
    MP_ASSERT(internal::Is<ExprType>(kind), "invalid expression kind");
    MP_ASSERT(lhs != 0 && rhs != 0, "invalid argument");
    typename ExprType::Impl *impl = Allocate<ExprType>(kind);
    impl->lhs = lhs.impl_;
    impl->rhs = rhs.impl_;
    return Expr::Create<ExprType>(impl);
  }